

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageSizeCase::iterate(ImageSizeCase *this)

{
  pointer *pppSVar1;
  ImageAccess IVar2;
  TextureType TVar3;
  RenderContext *context;
  TestLog *log;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  deUint32 target;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__s;
  ProgramSources *sources;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  RenderContext *renderContext;
  TextureFormat *format;
  char *pcVar7;
  CallLogWrapper glLog;
  Texture shaderOutResultTexture;
  Texture mainTexture;
  Buffer mainTextureBuf;
  string shaderImageTypeStr;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [40];
  string glslVersionDeclaration;
  string shaderImageFormatStr;
  ShaderProgram program;
  UniformAccessLogger uniforms;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar5),log);
  dVar6 = glu::getInternalFormat(this->m_format);
  target = getGLTextureTarget(this->m_imageType);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&mainTextureBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&mainTexture,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&shaderOutResultTexture,context);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::operator<<((ostream *)pppSVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"// Created a buffer for the texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::operator<<((ostream *)pppSVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  }
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::operator<<((ostream *)pppSVar1,") for storing the shader output");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,target,mainTexture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  setTextureStorage(&glLog,this->m_imageType,dVar6,&this->m_imageSize,
                    mainTextureBuf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,mainTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar6);
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  dVar6 = (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x800))();
  glu::checkError(dVar6,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaed);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
  glu::CallLogWrapper::glBindTexture
            (&glLog,0xde1,shaderOutResultTexture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,0xde1);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_100000001;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  setTextureStorage(&glLog,TEXTURETYPE_2D,0x8236,(IVec3 *)&program,0);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,1,shaderOutResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,0x8236);
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  dVar6 = (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x800))();
  renderContext = (RenderContext *)0xaf4;
  glu::checkError(dVar6,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaf4);
  IVar2 = this->m_imageAccess;
  if (IVar2 == IMAGEACCESS_READ_ONLY) {
    pcVar7 = "readonly";
  }
  else if (IVar2 == IMAGEACCESS_WRITE_ONLY) {
    pcVar7 = "writeonly";
  }
  else {
    pcVar7 = (char *)0x0;
    if (IVar2 == IMAGEACCESS_READ_ONLY_WRITE_ONLY) {
      pcVar7 = "readonly writeonly";
    }
  }
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)&this->m_format,format);
  getShaderImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,this->m_imageType,
             (TextureType)renderContext);
  type.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])(context);
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,__s,(allocator<char> *)&program);
  memset(&uniforms,0,0xac);
  std::operator+(&local_488,&glslVersionDeclaration,"\n");
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_4a8,(Functional *)(ulong)this->m_imageType,(TextureType)context,renderContext);
  std::operator+(&local_468,&local_488,&local_4a8);
  std::operator+(&local_448,&local_468,"\nprecision highp ");
  std::operator+(&local_428,&local_448,&shaderImageTypeStr);
  std::operator+(&local_408,&local_428,
                 ";\nprecision highp uimage2D;\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout ("
                );
  std::operator+(&local_3e8,&local_408,&shaderImageFormatStr);
  std::operator+(&local_3c8,&local_3e8,", binding=0) ");
  std::operator+(&local_3a8,&local_3c8,pcVar7);
  std::operator+(&local_388,&local_3a8," uniform ");
  std::operator+(&local_368,&local_388,&shaderImageTypeStr);
  std::operator+(&local_348,&local_368,
                 " u_image;\nlayout (r32ui, binding=1) writeonly uniform uimage2D u_result;\nvoid main (void)\n{\n"
                );
  TVar3 = this->m_imageType;
  if (((ulong)TVar3 < 8) && ((0x8bU >> (TVar3 & 0x1f) & 1) != 0)) {
    pcVar7 = &DAT_0189f8f4 + *(int *)(&DAT_0189f8f4 + (ulong)TVar3 * 4);
  }
  else {
    pcVar7 = (char *)0x0;
    if (TVar3 == TEXTURETYPE_2D_ARRAY) {
      pcVar7 = 
      "\tivec3 size = imageSize(u_image);\n\tint result = size.z*1000000 + size.y*1000 + size.x;\n";
    }
  }
  std::operator+(&local_328,&local_348,pcVar7);
  std::operator+(&local_308,&local_328,"\timageStore(u_result, ivec2(0, 0), uvec4(result));\n}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)local_2e8,&local_308);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&uniforms,(ShaderSource *)local_2e8);
  glu::ShaderProgram::ShaderProgram(&program,context,sources);
  std::__cxx11::string::~string((string *)(local_2e8 + 8));
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&uniforms);
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  uniforms.m_gl = (Functions *)CONCAT44(extraout_var_02,iVar5);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_programGL = program.m_program.m_program;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_log = log;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    glu::CallLogWrapper::glDispatchCompute(&glLog,1,1,1);
    iVar5 = (*context->_vptr_RenderContext[3])(context);
    dVar6 = (**(code **)(CONCAT44(extraout_var_03,iVar5) + 0x800))();
    glu::checkError(dVar6,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xb2a);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  if (program.m_program.m_info.linkOk != false) {
    TVar3 = this->m_imageType;
    if (TVar3 < TEXTURETYPE_2D_ARRAY) {
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ =
           (this->m_imageSize).m_data[1] * 1000 + (this->m_imageSize).m_data[0];
    }
    else if (TVar3 - TEXTURETYPE_2D_ARRAY < 2) {
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ =
           (this->m_imageSize).m_data[1] * 1000 + (this->m_imageSize).m_data[2] * 1000000 +
           (this->m_imageSize).m_data[0];
    }
    else if (TVar3 == TEXTURETYPE_BUFFER) {
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = (this->m_imageSize).m_data[0];
    }
    else {
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = -1;
    }
    local_2e8._0_4_ = R;
    local_2e8._4_4_ = UNSIGNED_INT32;
    uniforms.m_gl = (Functions *)&DAT_100000001;
    uniforms.m_log = (TestLog *)CONCAT44(uniforms.m_log._4_4_,1);
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR_operator___01e4b4d0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         (int)program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = readIntegerTextureViaFBOAndVerify
                      (context,&glLog,shaderOutResultTexture.super_ObjectWrapper.m_object,
                       TEXTURETYPE_2D,(TextureFormat *)local_2e8,(IVec3 *)&uniforms,
                       (ImageLayerVerifier *)&program);
    pcVar7 = "Got wrong value";
    if (bVar4) {
      pcVar7 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,pcVar7);
  }
  glu::ObjectWrapper::~ObjectWrapper(&shaderOutResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&mainTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&mainTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageSizeCase::IterateResult ImageSizeCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const glu::Buffer			mainTextureBuf			(renderCtx);
	const glu::Texture			mainTexture				(renderCtx);
	const glu::Texture			shaderOutResultTexture	(renderCtx);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *mainTexture << ")" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *mainTextureBuf << ")" << TestLog::EndMessage;
	log << TestLog::Message << "// Created a texture (name " << *shaderOutResultTexture << ") for storing the shader output" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *mainTexture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_imageType, internalFormatGL, m_imageSize, *mainTextureBuf);
	glLog.glBindImageTexture(0, *mainTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(GL_TEXTURE_2D, *shaderOutResultTexture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	setTextureStorage(glLog, TEXTURETYPE_2D, GL_R32UI, IVec3(1, 1, 1), 0 /* always 2d texture, no buffer needed */);
	glLog.glBindImageTexture(1, *shaderOutResultTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Read texture size in compute shader.

	{
		// Generate compute shader.

		const char* const	shaderImageAccessStr	= m_imageAccess == IMAGEACCESS_READ_ONLY			? "readonly"
													: m_imageAccess == IMAGEACCESS_WRITE_ONLY			? "writeonly"
													: m_imageAccess == IMAGEACCESS_READ_ONLY_WRITE_ONLY	? "readonly writeonly"
													: DE_NULL;
		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"precision highp uimage2D;\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + shaderImageAccessStr + " uniform " + shaderImageTypeStr + " u_image;\n"
														"layout (r32ui, binding=1) writeonly uniform uimage2D u_result;\n"
														"void main (void)\n"
														"{\n"
														+ (m_imageType == TEXTURETYPE_BUFFER ?
															"	int result = imageSize(u_image);\n"
														 : m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE ?
															"	ivec2 size = imageSize(u_image);\n"
															"	int result = size.y*1000 + size.x;\n"
														 : m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 size = imageSize(u_image);\n"
															"	int result = size.z*1000000 + size.y*1000 + size.x;\n"
														 : DE_NULL) +
														"	imageStore(u_result, ivec2(0, 0), uvec4(result));\n"
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and compare to reference.

	{
		const deUint32	referenceOutput		= m_imageType == TEXTURETYPE_BUFFER										? (deUint32)(												  m_imageSize.x())
											: m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE		? (deUint32)(						   m_imageSize.y()*1000 + m_imageSize.x())
											: m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY	? (deUint32)(m_imageSize.z()*1000000 + m_imageSize.y()*1000 + m_imageSize.x())
											: (deUint32)-1;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *shaderOutResultTexture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(referenceOutput)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}